

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::builtins::PrintTimeScaleTask::bindArgument
          (PrintTimeScaleTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  bool bVar1;
  Expression *pEVar2;
  Compilation *this_00;
  Compilation *compilation;
  InvalidExpression *pIVar3;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  SourceRange sourceRange;
  void *local_20;
  
  extraLookupFlags.m_bits = (underlying_type)args;
  if (argIndex != 0) {
    pEVar2 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
    return pEVar2;
  }
  this_00 = ASTContext::getCompilation(context);
  bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  if (bVar1) {
    compilation = (Compilation *)
                  slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                            (&syntax->super_SyntaxNode);
    pEVar2 = HierarchicalReferenceExpression::fromSyntax
                       ((HierarchicalReferenceExpression *)this_00,compilation,(NameSyntax *)context
                        ,(ASTContext *)0x0,extraLookupFlags);
    return pEVar2;
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
  ASTContext::addDiag(context,(DiagCode)0xc000b,sourceRange);
  local_20 = (void *)0x0;
  pIVar3 = BumpAllocator::
           emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                     (&this_00->super_BumpAllocator,&local_20,this_00->errorType);
  return &pIVar3->super_Expression;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex == 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModuleName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            return HierarchicalReferenceExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                               context);
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }